

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

void duckdb::ApproxQuantileListOperation<duckdb::hugeint_t>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  ApproximateQuantileBindData *pAVar1;
  Value q_00;
  size_type sVar2;
  Value VVar3;
  undefined8 *in_RDX;
  Value *in_RSI;
  long in_RDI;
  hugeint_t *target_00;
  hugeint_t *target_1;
  Value *source;
  value_type *quantile;
  size_t q;
  list_entry_t *entry;
  hugeint_t *rdata;
  idx_t ridx;
  Vector *result;
  ApproximateQuantileBindData *bind_data;
  FunctionData *in_stack_ffffffffffffff90;
  TDigest *this;
  Value local_48;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RDI + 8) == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90);
    pAVar1 = FunctionData::Cast<duckdb::ApproximateQuantileBindData>(in_stack_ffffffffffffff90);
    duckdb::ListVector::GetEntry((Vector *)*in_RDX);
    q_00 = (Value)duckdb::ListVector::GetListSize((Vector *)*in_RDX);
    this = (TDigest *)*in_RDX;
    VVar3 = q_00;
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      (&(pAVar1->quantiles).super_vector<float,_std::allocator<float>_>);
    duckdb::ListVector::Reserve((Vector *)this,(long)q_00 + sVar2);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xaf210c);
    duckdb_tdigest::TDigest::compress((TDigest *)0xaf211e);
    *in_RSI = VVar3;
    VVar3 = (Value)std::vector<float,_std::allocator<float>_>::size
                             (&(pAVar1->quantiles).super_vector<float,_std::allocator<float>_>);
    in_RSI[1] = VVar3;
    for (local_48 = 0.0; (ulong)local_48 < (ulong)in_RSI[1]; local_48 = (Value)((long)local_48 + 1))
    {
      vector<float,_true>::operator[]((vector<float,_true> *)this,(size_type)q_00);
      target_00 = (hugeint_t *)duckdb_tdigest::TDigest::quantile(this,q_00);
      ApproxQuantileCoding::Decode<double,duckdb::hugeint_t>
                ((double *)&stack0xffffffffffffffa0,target_00);
    }
    duckdb::ListVector::SetListSize((Vector *)*in_RDX,(long)*in_RSI + (long)in_RSI[1]);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}